

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

void __thiscall absl::Cord::SetExpectedChecksum(Cord *this,uint32_t crc)

{
  Rep *pRVar1;
  CrcCordState state;
  CrcCordState CStack_38;
  CrcCordState local_30;
  PrefixCrc local_28;
  
  crc_internal::CrcCordState::CrcCordState(&local_30);
  pRVar1 = crc_internal::CrcCordState::mutable_rep(&local_30);
  local_28.length = (size_t)(this->contents_).data_.rep_.field_0.data[0];
  if ((local_28.length & 1) == 0) {
    local_28.length = local_28.length >> 1;
  }
  else {
    local_28.length = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  local_28.crc.crc_ = crc;
  std::
  deque<absl::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::crc_internal::CrcCordState::PrefixCrc>_>
  ::emplace_back<absl::crc_internal::CrcCordState::PrefixCrc>(&pRVar1->prefix_crc,&local_28);
  crc_internal::CrcCordState::CrcCordState(&CStack_38,&local_30);
  SetCrcCordState(this,&CStack_38);
  crc_internal::CrcCordState::~CrcCordState(&CStack_38);
  crc_internal::CrcCordState::~CrcCordState(&local_30);
  return;
}

Assistant:

void Cord::SetExpectedChecksum(uint32_t crc) {
  // Construct a CrcCordState with a single chunk.
  crc_internal::CrcCordState state;
  state.mutable_rep()->prefix_crc.push_back(
      crc_internal::CrcCordState::PrefixCrc(size(), absl::crc32c_t{crc}));
  SetCrcCordState(std::move(state));
}